

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepImageChannel.h
# Opt level: O0

void __thiscall
Imf_2_5::TypedDeepImageChannel<half>::setSamplesToZero
          (TypedDeepImageChannel<half> *this,size_t i,uint oldNumSamples,uint newNumSamples)

{
  uint in_ECX;
  uint in_EDX;
  undefined8 in_RDI;
  uint j;
  undefined4 in_stack_ffffffffffffffe0;
  
  for (; in_EDX < in_ECX; in_EDX = in_EDX + 1) {
    half::operator=((half *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                    (float)((ulong)in_RDI >> 0x20));
  }
  return;
}

Assistant:

void
TypedDeepImageChannel<T>::setSamplesToZero
    (size_t i,
     unsigned int oldNumSamples,
     unsigned int newNumSamples)
{
    //
    // Expand the size of a sample list for a single pixel and
    // set the new samples in the list to 0.
    //
    // i                The position of the affected pixel in
    //                  the channel's _sampleListPointers.
    //
    // oldNumSamples    Original number of samples in the sample list.
    //
    // newNumSamples    New number of samples in the sample list.
    //

    for (unsigned int j = oldNumSamples; j < newNumSamples; ++j)
        _sampleListPointers[i][j] = 0;
}